

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O2

void NULLC::TraceSetEnabled(bool enabled)

{
  OutputContext *this;
  void *pvVar1;
  
  this = traceContext;
  if ((bool)traceContext[1].outputBufDef[0] != enabled) {
    if (!enabled) {
      traceContext[1].outputBufDef[0] = '\0';
      TraceDump();
      OutputContext::Flush(this);
      return;
    }
    traceContext[1].outputBufDef[0] = '\x01';
    this[1].outputBufDef[0x30] = '\0';
    this[1].outputBufDef[0x31] = '\0';
    this[1].outputBufDef[0x32] = '\0';
    this[1].outputBufDef[0x33] = '\0';
    this[1].outputBufDef[0x20] = '\0';
    this[1].outputBufDef[0x21] = '\0';
    this[1].outputBufDef[0x22] = '\0';
    this[1].outputBufDef[0x23] = '\0';
    if (this->stream == (void *)0x0) {
      TraceArray<char>::Resize((TraceArray<char> *)(this[1].outputBufDef + 0x40),0x8000);
      TraceArray<char>::Resize((TraceArray<char> *)(this[1].outputBufDef + 0x50),0x400);
      pvVar1 = (*this->openStream)("trace.json");
      this->stream = pvVar1;
      this->outputBuf = *(char **)(this[1].outputBufDef + 0x48);
      this->outputBufSize = *(uint *)(this[1].outputBufDef + 0x44);
      this->tempBuf = *(char **)(this[1].outputBufDef + 0x58);
      this->tempBufSize = *(uint *)(this[1].outputBufDef + 0x54);
      OutputContext::Print(this,'[');
      TraceArray<char>::Resize((TraceArray<char> *)(this[1].outputBufDef + 0x20),0x40000);
      TraceArray<NULLC::TraceEvent>::Resize
                ((TraceArray<NULLC::TraceEvent> *)(this[1].outputBufDef + 0x30),0x20000);
      return;
    }
  }
  return;
}

Assistant:

inline void TraceSetEnabled(bool enabled)
	{
		TraceContext &context = *traceContext;

		if(context.outputEnabled == enabled)
			return;

		if(enabled)
		{
			context.outputEnabled = true;

			// Clear what was already recorded
			context.events.count = 0;
			context.labels.count = 0;

			if(!context.output.stream)
			{
				context.outputBuf.Resize(32768);
				context.tempBuf.Resize(1024);

				context.output.stream = context.output.openStream("trace.json");

				context.output.outputBuf = context.outputBuf.data;
				context.output.outputBufSize = context.outputBuf.max;

				context.output.tempBuf = context.tempBuf.data;
				context.output.tempBufSize = context.tempBuf.max;

				context.output.Print('[');

				context.labels.Resize(262144);
				context.events.Resize(131072);
			}
		}
		else
		{
			context.outputEnabled = false;

			TraceDump();

			context.output.Flush();
		}
	}